

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

bool embree::test_location
               (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *in,ssize_t ipos,
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               *out,ssize_t opos)

{
  float *pfVar1;
  float *pfVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined4 unaff_EBP;
  int iVar9;
  ssize_t sVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (opos < 0) {
    return false;
  }
  pvVar3 = (out->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (in->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (in->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pvVar5 - (long)pvVar4 >> 5;
  sVar10 = ipos;
  do {
    if ((long)pvVar3->size_active <= opos) {
      return true;
    }
    if (pvVar5 != pvVar4) {
      lVar8 = 0x18;
      lVar12 = lVar11 + (ulong)(lVar11 == 0);
      do {
        pfVar1 = (float *)(*(long *)(&pvVar4->field_0x0 + lVar8) + sVar10 * 0x10);
        pfVar2 = (float *)(*(long *)(&pvVar3->field_0x0 + lVar8) + opos * 0x10);
        auVar13._0_8_ = *(ulong *)pfVar1 & 0x7fffffff7fffffff;
        auVar13._8_4_ = ABS(pfVar1[2]);
        auVar13._12_4_ = ABS(pfVar1[3]);
        auVar14._8_4_ = ABS(pfVar2[2]);
        auVar14._0_8_ = *(ulong *)pfVar2 & 0x7fffffff7fffffff;
        auVar14._12_4_ = ABS(pfVar2[3]);
        auVar14 = maxps(auVar13,auVar14);
        auVar7._4_4_ = -(uint)(auVar14._4_4_ * 0.01 < ABS(pfVar1[1] - pfVar2[1]));
        auVar7._0_4_ = -(uint)(auVar14._0_4_ * 0.01 < ABS(*pfVar1 - *pfVar2));
        auVar7._8_4_ = -(uint)(auVar14._8_4_ * 0.01 < ABS(pfVar1[2] - pfVar2[2]));
        auVar7._12_4_ = -(uint)(auVar14._12_4_ * 0.01 < ABS(pfVar1[3] - pfVar2[3]));
        iVar9 = movmskps(unaff_EBP,auVar7);
        if (iVar9 != 0) {
          return false;
        }
        lVar8 = lVar8 + 0x20;
        lVar12 = lVar12 + -1;
        unaff_EBP = 0;
      } while (lVar12 != 0);
    }
    opos = opos + 1;
    bVar6 = sVar10 < ipos + 3;
    sVar10 = sVar10 + 1;
  } while (bVar6);
  return true;
}

Assistant:

bool test_location(const std::vector<avector<Vec3ff>>& in, ssize_t ipos, std::vector<avector<Vec3ff>>& out, ssize_t opos)
  {
    if (opos < 0) 
      return false;

    for (ssize_t i=ipos, j=opos; i<ipos+4 && j<(ssize_t)out[0].size(); i++, j++) {
      for (size_t k=0; k<in.size(); k++) {
        if (any(abs((vfloat4)in[k][i].m128-(vfloat4)out[k][j].m128) > 0.01f*(vfloat4)max(abs(in[k][i]),abs(out[k][j])).m128))
          return false;
      }
    }
    return true;
  }